

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

string * __thiscall
libcellml::GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mInterfaceInitialiseVariablesMethodFdmWevString);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mInterfaceInitialiseVariablesMethodFdmWoevString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mInterfaceInitialiseVariablesMethodFamWevString);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mInterfaceInitialiseVariablesMethodFamWoevString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::interfaceInitialiseVariablesMethodString(bool forDifferentialModel,
                                                                       bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mInterfaceInitialiseVariablesMethodFdmWevString;
        }

        return mPimpl->mInterfaceInitialiseVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mInterfaceInitialiseVariablesMethodFamWevString;
    }

    return mPimpl->mInterfaceInitialiseVariablesMethodFamWoevString;
}